

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O3

Maybe<capnp::Capability::Client> * __thiscall
capnp::_::anon_unknown_0::MembranePolicyImpl::outboundCall
          (Maybe<capnp::Capability::Client> *__return_storage_ptr__,MembranePolicyImpl *this,
          uint64_t interfaceId,uint16_t methodId,Client target)

{
  Server *pSVar1;
  undefined8 *puVar2;
  undefined6 in_register_0000000a;
  Own<capnp::ClientHook> OVar3;
  Own<capnp::Capability::Server> local_28;
  Client local_18;
  
  if ((int)CONCAT62(in_register_0000000a,methodId) == 1 && interfaceId == 0x9352e4e41f173917) {
    puVar2 = (undefined8 *)operator_new(0x28);
    local_28.ptr = (Server *)(puVar2 + 3);
    puVar2[4] = 0;
    *puVar2 = 0x60a990;
    puVar2[3] = 0x60a9c0;
    puVar2[1] = "outbound";
    puVar2[2] = 9;
    local_28.disposer =
         (Disposer *)&kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::ThingImpl>::instance;
    OVar3 = Capability::Client::makeLocalClient(&local_18,&local_28);
    pSVar1 = local_28.ptr;
    if (local_28.ptr != (Server *)0x0) {
      local_28.ptr = (Server *)0x0;
      (**(local_28.disposer)->_vptr_Disposer)
                (local_28.disposer,
                 (_func_int *)((long)&pSVar1->_vptr_Server + (long)pSVar1->_vptr_Server[-2]),
                 OVar3.ptr);
    }
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.hook.disposer = local_18.hook.disposer;
    (__return_storage_ptr__->ptr).field_1.value.hook.ptr = local_18.hook.ptr;
  }
  else {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Capability::Client> outboundCall(uint64_t interfaceId, uint16_t methodId,
                                             Capability::Client target) override {
    if (interfaceId == capnp::typeId<Thing>() && methodId == 1) {
      return Capability::Client(kj::heap<ThingImpl>("outbound"));
    } else {
      return nullptr;
    }
  }